

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeMemoryCopy(TranslateToFuzzReader *this)

{
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var1;
  Expression *pEVar2;
  Expression *source;
  Expression *size;
  MemoryCopy *pMVar3;
  
  if (this->allowMemory != false) {
    pEVar2 = makePointer(this);
    source = makePointer(this);
    size = make(this,(Type)*(uintptr_t *)
                            ((long)(((this->wasm->memories).
                                     super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                   super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                            + 0x50));
    _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((this->wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
    pMVar3 = Builder::makeMemoryCopy
                       (&this->builder,pEVar2,source,size,
                        (Name)*(string_view *)
                               _Var1.
                               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                               .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,
                        (Name)*(string_view *)
                               _Var1.
                               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                               .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl);
    return (Expression *)pMVar3;
  }
  pEVar2 = makeTrivial(this,(Type)0x0);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeMemoryCopy() {
  if (!allowMemory) {
    return makeTrivial(Type::none);
  }
  Expression* dest = makePointer();
  Expression* source = makePointer();
  Expression* size = make(wasm.memories[0]->addressType);
  return builder.makeMemoryCopy(
    dest, source, size, wasm.memories[0]->name, wasm.memories[0]->name);
}